

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     Finalize<duckdb::QuantileState<duckdb::date_t,duckdb::QuantileStandardType>,duckdb::interval_t,duckdb::MedianAbsoluteDeviationOperation<duckdb::timestamp_t>>
               (Vector *states,AggregateInputData *aggr_input_data,Vector *result,idx_t count,
               idx_t offset)

{
  VectorType VVar1;
  AggregateFinalizeData *in_RCX;
  Vector *in_RDX;
  QuantileState<duckdb::date_t,_duckdb::QuantileStandardType> *in_RSI;
  Vector *in_RDI;
  long in_R8;
  idx_t i;
  AggregateFinalizeData finalize_data_1;
  interval_t *rdata_1;
  QuantileState<duckdb::date_t,_duckdb::QuantileStandardType> **sdata_1;
  AggregateFinalizeData finalize_data;
  interval_t *rdata;
  QuantileState<duckdb::date_t,_duckdb::QuantileStandardType> **sdata;
  AggregateFinalizeData *local_80;
  AggregateFinalizeData local_78;
  interval_t *local_60;
  undefined8 in_stack_ffffffffffffffa8;
  VectorType vector_type_p;
  Vector *in_stack_ffffffffffffffb0;
  
  vector_type_p = (VectorType)((ulong)in_stack_ffffffffffffffa8 >> 0x38);
  VVar1 = Vector::GetVectorType(in_RDI);
  if (VVar1 == CONSTANT_VECTOR) {
    Vector::SetVectorType(in_stack_ffffffffffffffb0,vector_type_p);
    ConstantVector::GetData<duckdb::QuantileState<duckdb::date_t,duckdb::QuantileStandardType>*>
              ((Vector *)0x1dcfff0);
    ConstantVector::GetData<duckdb::interval_t>((Vector *)0x1dcffff);
    AggregateFinalizeData::AggregateFinalizeData
              ((AggregateFinalizeData *)&stack0xffffffffffffffb0,in_RDX,(AggregateInputData *)in_RSI
              );
    MedianAbsoluteDeviationOperation<duckdb::timestamp_t>::
    Finalize<duckdb::interval_t,duckdb::QuantileState<duckdb::date_t,duckdb::QuantileStandardType>>
              (in_RSI,(interval_t *)in_RDX,in_RCX);
  }
  else {
    Vector::SetVectorType(in_stack_ffffffffffffffb0,vector_type_p);
    FlatVector::GetData<duckdb::QuantileState<duckdb::date_t,duckdb::QuantileStandardType>*>
              ((Vector *)0x1dd004d);
    local_60 = FlatVector::GetData<duckdb::interval_t>((Vector *)0x1dd005c);
    AggregateFinalizeData::AggregateFinalizeData(&local_78,in_RDX,(AggregateInputData *)in_RSI);
    for (local_80 = (AggregateFinalizeData *)0x0; local_80 < in_RCX;
        local_80 = (AggregateFinalizeData *)((long)&local_80->result + 1)) {
      local_78.result_idx = (long)&local_80->result + in_R8;
      MedianAbsoluteDeviationOperation<duckdb::timestamp_t>::
      Finalize<duckdb::interval_t,duckdb::QuantileState<duckdb::date_t,duckdb::QuantileStandardType>>
                (in_RSI,(interval_t *)in_RDX,in_RCX);
    }
  }
  return;
}

Assistant:

static void Finalize(Vector &states, AggregateInputData &aggr_input_data, Vector &result, idx_t count,
	                     idx_t offset) {
		if (states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);

			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			auto rdata = ConstantVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			OP::template Finalize<RESULT_TYPE, STATE_TYPE>(**sdata, *rdata, finalize_data);
		} else {
			D_ASSERT(states.GetVectorType() == VectorType::FLAT_VECTOR);
			result.SetVectorType(VectorType::FLAT_VECTOR);

			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			for (idx_t i = 0; i < count; i++) {
				finalize_data.result_idx = i + offset;
				OP::template Finalize<RESULT_TYPE, STATE_TYPE>(*sdata[i], rdata[finalize_data.result_idx],
				                                               finalize_data);
			}
		}
	}